

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

bool __thiscall BCLog::Logger::WillLogCategoryLevel(Logger *this,LogFlags category,Level level)

{
  long lVar1;
  bool bVar2;
  Level LVar3;
  pointer pvVar4;
  int in_EDX;
  long in_FS_OFFSET;
  const_iterator it;
  StdLockGuard scoped_lock;
  Logger *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Logger *in_stack_ffffffffffffffa0;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX < 2) {
    bVar2 = WillLogCategory(in_stack_ffffffffffffffa0,
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (bVar2) {
      StdLockGuard::StdLockGuard((StdLockGuard *)in_stack_ffffffffffffff88,(StdMutex *)0x1fc1db);
      std::
      unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
      ::find((unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
              *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (key_type *)in_stack_ffffffffffffff88);
      std::
      unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
      ::end((unordered_map<BCLog::LogFlags,_BCLog::Level,_std::hash<BCLog::LogFlags>,_std::equal_to<BCLog::LogFlags>,_std::allocator<std::pair<const_BCLog::LogFlags,_BCLog::Level>_>_>
             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      bVar2 = std::__detail::operator==
                        ((_Node_iterator_base<std::pair<const_BCLog::LogFlags,_BCLog::Level>,_false>
                          *)CONCAT44(in_EDX,in_stack_ffffffffffffff98),
                         (_Node_iterator_base<std::pair<const_BCLog::LogFlags,_BCLog::Level>,_false>
                          *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (bVar2) {
        LVar3 = LogLevel(in_stack_ffffffffffffff88);
      }
      else {
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_BCLog::LogFlags,_BCLog::Level>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_BCLog::LogFlags,_BCLog::Level>,_false,_false>
                               *)in_stack_ffffffffffffff88);
        LVar3 = pvVar4->second;
      }
      local_29 = (int)LVar3 <= in_EDX;
      StdLockGuard::~StdLockGuard((StdLockGuard *)in_stack_ffffffffffffff88);
    }
    else {
      local_29 = false;
    }
  }
  else {
    local_29 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool BCLog::Logger::WillLogCategoryLevel(BCLog::LogFlags category, BCLog::Level level) const
{
    // Log messages at Info, Warning and Error level unconditionally, so that
    // important troubleshooting information doesn't get lost.
    if (level >= BCLog::Level::Info) return true;

    if (!WillLogCategory(category)) return false;

    StdLockGuard scoped_lock(m_cs);
    const auto it{m_category_log_levels.find(category)};
    return level >= (it == m_category_log_levels.end() ? LogLevel() : it->second);
}